

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::setOutputFilename(QPDFWriter *this,char *filename)

{
  FILE *pFStack_28;
  bool close_file;
  FILE *f;
  char *description;
  char *filename_local;
  QPDFWriter *this_local;
  
  if (filename != (char *)0x0) {
    QTC::TC("qpdf","QPDFWriter write to file",0);
    pFStack_28 = QUtil::safe_fopen(filename,"wb+");
    f = (FILE *)filename;
  }
  else {
    f = (FILE *)0x41771c;
    QTC::TC("qpdf","QPDFWriter write to stdout",0);
    pFStack_28 = _stdout;
    QUtil::binary_stdout();
  }
  setOutputFile(this,(char *)f,pFStack_28,filename != (char *)0x0);
  return;
}

Assistant:

void
QPDFWriter::setOutputFilename(char const* filename)
{
    char const* description = filename;
    FILE* f = nullptr;
    bool close_file = false;
    if (filename == nullptr) {
        description = "standard output";
        QTC::TC("qpdf", "QPDFWriter write to stdout");
        f = stdout;
        QUtil::binary_stdout();
    } else {
        QTC::TC("qpdf", "QPDFWriter write to file");
        f = QUtil::safe_fopen(filename, "wb+");
        close_file = true;
    }
    setOutputFile(description, f, close_file);
}